

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_loose_invert(fe *out,fe_loose *z)

{
  int iVar1;
  bool bVar2;
  fe t2;
  fe t1;
  fe t3;
  fe t0;
  
  fe_sq_tl(&t0,z);
  fe_sq_tt(&t1,&t0);
  fe_sq_tt(&t1,&t1);
  fe_mul_impl(t1.v,z->v,t1.v);
  fe_mul_impl(t0.v,t0.v,t1.v);
  fe_sq_tt(&t2,&t0);
  fe_mul_impl(t1.v,t1.v,t2.v);
  fe_sq_tt(&t2,&t1);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t2,&t2);
  }
  fe_mul_impl(t1.v,t2.v,t1.v);
  fe_sq_tt(&t2,&t1);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t2,&t2);
  }
  fe_mul_impl(t2.v,t2.v,t1.v);
  fe_sq_tt(&t3,&t2);
  iVar1 = 0x13;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t3,&t3);
  }
  fe_mul_impl(t2.v,t3.v,t2.v);
  fe_sq_tt(&t2,&t2);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t2,&t2);
  }
  fe_mul_impl(t1.v,t2.v,t1.v);
  fe_sq_tt(&t2,&t1);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t2,&t2);
  }
  fe_mul_impl(t2.v,t2.v,t1.v);
  fe_sq_tt(&t3,&t2);
  iVar1 = 99;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t3,&t3);
  }
  fe_mul_impl(t2.v,t3.v,t2.v);
  fe_sq_tt(&t2,&t2);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t2,&t2);
  }
  fe_mul_impl(t1.v,t2.v,t1.v);
  fe_sq_tt(&t1,&t1);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq_tt(&t1,&t1);
  }
  fe_mul_impl(out->v,t1.v,t0.v);
  return;
}

Assistant:

static void fe_loose_invert(fe *out, const fe_loose *z) {
  fe t0;
  fe t1;
  fe t2;
  fe t3;
  int i;

  fe_sq_tl(&t0, z);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 2; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_tlt(&t1, z, &t1);
  fe_mul_ttt(&t0, &t0, &t1);
  fe_sq_tt(&t2, &t0);
  fe_mul_ttt(&t1, &t1, &t2);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t2, &t2, &t1);
  fe_sq_tt(&t3, &t2);
  for (i = 1; i < 20; ++i) {
    fe_sq_tt(&t3, &t3);
  }
  fe_mul_ttt(&t2, &t3, &t2);
  fe_sq_tt(&t2, &t2);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t2, &t2, &t1);
  fe_sq_tt(&t3, &t2);
  for (i = 1; i < 100; ++i) {
    fe_sq_tt(&t3, &t3);
  }
  fe_mul_ttt(&t2, &t3, &t2);
  fe_sq_tt(&t2, &t2);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t1, &t1);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(out, &t1, &t0);
}